

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O3

void __thiscall
Minisat::Heap<Minisat::SimpSolver::ElimLt>::percolateUp
          (Heap<Minisat::SimpSolver::ElimLt> *this,int i)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  
  piVar3 = (this->heap).data;
  iVar1 = piVar3[i];
  if (i == 0) {
    piVar7 = (this->indices).data;
    piVar5 = piVar3;
    i = 0;
  }
  else {
    piVar7 = (this->indices).data;
    piVar4 = ((this->lt).n_occ)->data;
    do {
      uVar6 = i - 1;
      iVar8 = (int)uVar6 >> 1;
      iVar2 = piVar3[iVar8];
      piVar5 = piVar3 + i;
      if ((ulong)((long)piVar4[iVar2 * 2 + 1] * (long)piVar4[(long)iVar2 * 2]) <=
          (ulong)((long)piVar4[iVar1 * 2 + 1] * (long)piVar4[(long)iVar1 * 2])) break;
      piVar3[i] = iVar2;
      piVar7[piVar3[iVar8]] = i;
      piVar5 = piVar3;
      i = iVar8;
    } while (1 < uVar6);
  }
  *piVar5 = iVar1;
  piVar7[iVar1] = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x = heap[i];
        int p = parent(i);

        while (i != 0 && lt(x, heap[p])) {
            heap[i] = heap[p];
            indices[heap[p]] = i;
            i = p;
            p = parent(p);
        }
        heap[i] = x;
        indices[x] = i;
    }